

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O3

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType>_>_>
* __thiscall
(anonymous_namespace)::getScopedLinkLibrariesFromTarget_abi_cxx11_
          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType>_>_>
           *__return_storage_ptr__,_anonymous_namespace_ *this,cmTarget *Target,
          cmGlobalGenerator *globalGenerator)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType>_>_>
  *pmVar1;
  _Link_type p_Var2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType>_>_>
  *pmVar7;
  size_t sVar8;
  ulong uVar9;
  cmTarget *pcVar10;
  long lVar11;
  mapped_type *pmVar12;
  ulong uVar13;
  iterator iVar14;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType>_>_>
  *extraout_RAX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__k;
  string interfaceLinkLibraries;
  string element;
  string linkLibraries;
  undefined1 local_98 [32];
  _Alloc_hider local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  _Base_ptr local_58;
  ulong local_50;
  long local_48;
  _Link_type local_38;
  
  local_38 = (_Link_type)&(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)local_38;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)local_38;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  pmVar1 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType>_>_>
            *)(local_98 + 0x10);
  local_98._0_8_ = pmVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"INTERFACE_LINK_LIBRARIES","");
  pcVar5 = cmTarget::GetProperty((cmTarget *)this,(string *)local_98);
  if ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType>_>_>
       *)local_98._0_8_ != pmVar1) {
    operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
  }
  local_98._0_8_ = pmVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"LINK_LIBRARIES","");
  pcVar6 = cmTarget::GetProperty((cmTarget *)this,(string *)local_98);
  if ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType>_>_>
       *)local_98._0_8_ != pmVar1) {
    operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
  }
  pmVar7 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType>_>_>
            *)((ulong)pcVar5 | (ulong)pcVar6);
  if (pmVar7 != (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType>_>_>
                 *)0x0) {
    if (pcVar5 == (char *)0x0) {
      pcVar5 = "";
    }
    local_98._0_8_ = pmVar1;
    sVar8 = strlen(pcVar5);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_98,pcVar5,pcVar5 + sVar8);
    pcVar5 = "";
    if (pcVar6 != (char *)0x0) {
      pcVar5 = pcVar6;
    }
    local_58 = (_Base_ptr)&local_48;
    sVar8 = strlen(pcVar5);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,pcVar5,pcVar5 + sVar8);
    if (local_98._8_8_ != 0) {
      do {
        uVar9 = std::__cxx11::string::find((char)local_98,0x3b);
        if (uVar9 == 0xffffffffffffffff) {
          uVar9 = local_98._8_8_;
        }
        std::__cxx11::string::substr((ulong)&local_78,(ulong)local_98);
        bVar3 = cmGlobalGenerator::IsAlias((cmGlobalGenerator *)Target,(string *)&local_78);
        if (bVar3) {
          pcVar10 = cmGlobalGenerator::FindTarget
                              ((cmGlobalGenerator *)Target,(string *)&local_78,false);
          if (pcVar10 != (cmTarget *)0x0) {
            cmTarget::GetName_abi_cxx11_(pcVar10);
            std::__cxx11::string::_M_assign((string *)&local_78);
          }
        }
        lVar11 = std::__cxx11::string::find((char *)&local_78,0x52c9de,0);
        if (lVar11 == -1) {
          pmVar12 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType>_>_>
                    ::operator[](__return_storage_ptr__,(string *)&local_78);
          *pmVar12 = LLT_SCOPE_INTERFACE;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_p != &local_68) {
          operator_delete(local_78._M_p,local_68._M_allocated_capacity + 1);
        }
      } while (uVar9 + 1 < (ulong)local_98._8_8_);
    }
    if (local_50 != 0) {
      uVar9 = 0;
      do {
        uVar13 = std::__cxx11::string::find((char)&local_58,0x3b);
        if (uVar13 == 0xffffffffffffffff) {
          uVar13 = local_50;
        }
        __k = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(uVar13 - uVar9);
        std::__cxx11::string::substr((ulong)&local_78,(ulong)&local_58);
        bVar3 = cmGlobalGenerator::IsAlias((cmGlobalGenerator *)Target,(string *)&local_78);
        if (bVar3) {
          pcVar10 = cmGlobalGenerator::FindTarget
                              ((cmGlobalGenerator *)Target,(string *)&local_78,false);
          if (pcVar10 != (cmTarget *)0x0) {
            cmTarget::GetName_abi_cxx11_(pcVar10);
            std::__cxx11::string::_M_assign((string *)&local_78);
          }
        }
        p_Var2 = local_38;
        iVar14 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType>_>_>
                 ::_M_lower_bound((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType>_>_>
                                   *)(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header.
                                     _M_header._M_parent,local_38,(_Base_ptr)&local_78,__k);
        if ((_Link_type)iVar14._M_node == p_Var2) {
LAB_0033915c:
          pmVar12 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType>_>_>
                    ::operator[](__return_storage_ptr__,(key_type *)&local_78);
          *pmVar12 = LLT_SCOPE_PRIVATE;
        }
        else {
          iVar4 = std::__cxx11::string::compare((string *)&local_78);
          if (iVar4 < 0) goto LAB_0033915c;
          pmVar12 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType>_>_>
                    ::operator[](__return_storage_ptr__,(key_type *)&local_78);
          if (*pmVar12 == LLT_SCOPE_INTERFACE) {
            pmVar12 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType>_>_>
                      ::operator[](__return_storage_ptr__,(key_type *)&local_78);
            *pmVar12 = LLT_SCOPE_PUBLIC;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_p != &local_68) {
          operator_delete(local_78._M_p,local_68._M_allocated_capacity + 1);
        }
        uVar9 = uVar13 + 1;
      } while (uVar9 < local_50);
    }
    if (local_58 != (_Base_ptr)&local_48) {
      operator_delete(local_58,local_48 + 1);
    }
    pmVar7 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType>_>_>
              *)(local_98 + 0x10);
    if ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType>_>_>
         *)local_98._0_8_ != pmVar7) {
      operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
      pmVar7 = extraout_RAX;
    }
  }
  return pmVar7;
}

Assistant:

std::map<std::string, LinkLibraryScopeType> getScopedLinkLibrariesFromTarget(
  cmTarget* Target, const cmGlobalGenerator* globalGenerator)
{
  char sep = ';';
  std::map<std::string, LinkLibraryScopeType> tokens;
  size_t start = 0, end = 0;

  const char* pInterfaceLinkLibraries =
    Target->GetProperty("INTERFACE_LINK_LIBRARIES");
  const char* pLinkLibraries = Target->GetProperty("LINK_LIBRARIES");

  if (!pInterfaceLinkLibraries && !pLinkLibraries) {
    return tokens; // target is not linked against any other libraries
  }

  // make sure we don't touch a null-ptr
  auto interfaceLinkLibraries =
    std::string(pInterfaceLinkLibraries ? pInterfaceLinkLibraries : "");
  auto linkLibraries = std::string(pLinkLibraries ? pLinkLibraries : "");

  // first extract interfaceLinkLibraries
  while (start < interfaceLinkLibraries.length()) {

    if ((end = interfaceLinkLibraries.find(sep, start)) == std::string::npos) {
      end = interfaceLinkLibraries.length();
    }

    std::string element = interfaceLinkLibraries.substr(start, end - start);
    if (globalGenerator->IsAlias(element)) {
      const auto tgt = globalGenerator->FindTarget(element);
      if (tgt) {
        element = tgt->GetName();
      }
    }

    if (std::string::npos == element.find("$<LINK_ONLY:", 0)) {
      // we assume first, that this library is an interface library.
      // if we find it again in the linklibraries property, we promote it to an
      // public library.
      tokens[element] = LLT_SCOPE_INTERFACE;
    } else {
      // this is an private linked static library.
      // we take care of this case in the second iterator.
    }
    start = end + 1;
  }

  // second extract linkLibraries
  start = 0;
  while (start < linkLibraries.length()) {

    if ((end = linkLibraries.find(sep, start)) == std::string::npos) {
      end = linkLibraries.length();
    }

    std::string element = linkLibraries.substr(start, end - start);
    if (globalGenerator->IsAlias(element)) {
      const auto tgt = globalGenerator->FindTarget(element);
      if (tgt) {
        element = tgt->GetName();
      }
    }

    if (tokens.find(element) == tokens.end()) {
      // this library is not found in interfaceLinkLibraries but in
      // linkLibraries.
      // this results in a private linked library.
      tokens[element] = LLT_SCOPE_PRIVATE;
    } else if (LLT_SCOPE_INTERFACE == tokens[element]) {
      // this library is found in interfaceLinkLibraries and linkLibraries.
      // this results in a public linked library.
      tokens[element] = LLT_SCOPE_PUBLIC;
    } else {
      // private and public linked libraries should not be changed anymore.
    }

    start = end + 1;
  }

  return tokens;
}